

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

void ngx_sort(void *base,size_t n,size_t size,_func_ngx_int_t_void_ptr_void_ptr *cmp)

{
  void *__src;
  void *__dest;
  void *__ptr;
  ngx_int_t nVar1;
  void *__src_00;
  
  __ptr = ngx_alloc(size,ngx_cycle->log);
  if (__ptr == (void *)0x0) {
    return;
  }
  __src_00 = base;
  do {
    __src = (void *)((long)__src_00 + size);
    if ((void *)(n * size + (long)base) <= __src) {
      free(__ptr);
      return;
    }
    memcpy(__ptr,__src,size);
    for (; __dest = (void *)((long)__src_00 + size), base < __dest;
        __src_00 = (void *)((long)__src_00 - size)) {
      nVar1 = (*cmp)(__src_00,__ptr);
      if (nVar1 < 1) break;
      memcpy(__dest,__src_00,size);
    }
    memcpy(__dest,__ptr,size);
    __src_00 = __src;
  } while( true );
}

Assistant:

void
ngx_sort(void *base, size_t n, size_t size,
    ngx_int_t (*cmp)(const void *, const void *))
{
    u_char  *p1, *p2, *p;

    p = ngx_alloc(size, ngx_cycle->log);
    if (p == NULL) {
        return;
    }

    for (p1 = (u_char *) base + size;
         p1 < (u_char *) base + n * size;
         p1 += size)
    {
        ngx_memcpy(p, p1, size);

        for (p2 = p1;
             p2 > (u_char *) base && cmp(p2 - size, p) > 0;
             p2 -= size)
        {
            ngx_memcpy(p2, p2 - size, size);
        }

        ngx_memcpy(p2, p, size);
    }

    ngx_free(p);
}